

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camellia.c
# Opt level: O0

int mbedtls_camellia_crypt_cbc
              (mbedtls_camellia_context *ctx,int mode,size_t length,uchar *iv,uchar *input,
              uchar *output)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uchar temp [16];
  uchar *puStack_40;
  int i;
  uchar *output_local;
  uchar *input_local;
  uchar *iv_local;
  size_t length_local;
  int mode_local;
  mbedtls_camellia_context *ctx_local;
  
  if ((length & 0xf) == 0) {
    puStack_40 = output;
    output_local = input;
    iv_local = (uchar *)length;
    if (mode == 0) {
      for (; iv_local != (uchar *)0x0; iv_local = iv_local + -0x10) {
        uVar1 = *(undefined8 *)output_local;
        uVar2 = *(undefined8 *)(output_local + 8);
        mbedtls_camellia_crypt_ecb(ctx,0,output_local,puStack_40);
        temp[0xc] = '\0';
        temp[0xd] = '\0';
        temp[0xe] = '\0';
        temp[0xf] = '\0';
        for (; (int)temp._12_4_ < 0x10; temp._12_4_ = temp._12_4_ + 1) {
          puStack_40[(int)temp._12_4_] = puStack_40[(int)temp._12_4_] ^ iv[(int)temp._12_4_];
        }
        *(undefined8 *)iv = uVar1;
        *(undefined8 *)(iv + 8) = uVar2;
        output_local = output_local + 0x10;
        puStack_40 = puStack_40 + 0x10;
      }
    }
    else {
      for (; iv_local != (uchar *)0x0; iv_local = iv_local + -0x10) {
        temp[0xc] = '\0';
        temp[0xd] = '\0';
        temp[0xe] = '\0';
        temp[0xf] = '\0';
        for (; (int)temp._12_4_ < 0x10; temp._12_4_ = temp._12_4_ + 1) {
          puStack_40[(int)temp._12_4_] = output_local[(int)temp._12_4_] ^ iv[(int)temp._12_4_];
        }
        mbedtls_camellia_crypt_ecb(ctx,mode,puStack_40,puStack_40);
        *(undefined8 *)iv = *(undefined8 *)puStack_40;
        *(undefined8 *)(iv + 8) = *(undefined8 *)(puStack_40 + 8);
        output_local = output_local + 0x10;
        puStack_40 = puStack_40 + 0x10;
      }
    }
    ctx_local._4_4_ = 0;
  }
  else {
    ctx_local._4_4_ = -0x26;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_camellia_crypt_cbc( mbedtls_camellia_context *ctx,
                    int mode,
                    size_t length,
                    unsigned char iv[16],
                    const unsigned char *input,
                    unsigned char *output )
{
    int i;
    unsigned char temp[16];

    if( length % 16 )
        return( MBEDTLS_ERR_CAMELLIA_INVALID_INPUT_LENGTH );

    if( mode == MBEDTLS_CAMELLIA_DECRYPT )
    {
        while( length > 0 )
        {
            memcpy( temp, input, 16 );
            mbedtls_camellia_crypt_ecb( ctx, mode, input, output );

            for( i = 0; i < 16; i++ )
                output[i] = (unsigned char)( output[i] ^ iv[i] );

            memcpy( iv, temp, 16 );

            input  += 16;
            output += 16;
            length -= 16;
        }
    }
    else
    {
        while( length > 0 )
        {
            for( i = 0; i < 16; i++ )
                output[i] = (unsigned char)( input[i] ^ iv[i] );

            mbedtls_camellia_crypt_ecb( ctx, mode, output, output );
            memcpy( iv, output, 16 );

            input  += 16;
            output += 16;
            length -= 16;
        }
    }

    return( 0 );
}